

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initResourceFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *pQVar1;
  ProStringList *pPVar2;
  long lVar3;
  QString *qrc_file;
  QString *inpf;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QString local_e8;
  QArrayDataPointer<QString> local_c8;
  QArrayDataPointer<QString> local_a8;
  ProString local_88;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).ResourceFiles;
  QVar4.m_size = (size_t)"Resource Files";
  QVar4.field_0.m_data = this_00;
  QString::assign(QVar4);
  (this->vcProject).ResourceFiles.ParseFiles = _False;
  QVar5.m_size = (size_t)"qrc;*";
  QVar5.field_0.m_data = &(this->vcProject).ResourceFiles.Filter;
  QString::assign(QVar5);
  QVar6.m_size = (size_t)"{D9D6E242-F8AF-46E4-B9FD-80ECBC20BA3E}";
  QVar6.field_0.m_data = &(this->vcProject).ResourceFiles.Guid;
  QString::assign(QVar6);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"rcc.depend_command");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  ProStringList::join(&local_58,pPVar2,(QChar)0x20);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_88,"RESOURCES");
    pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
    ProStringList::toQStringList((QStringList *)&local_a8,pPVar2);
    if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
      lVar3 = local_a8.size * 0x18;
      inpf = local_a8.ptr;
      do {
        ProString::ProString(&local_88,"rcc");
        local_e8.d.d = (Data *)0x0;
        local_e8.d.ptr = (char16_t *)0x0;
        local_e8.d.size = 0;
        MakefileGenerator::callExtraCompilerDependCommand
                  ((MakefileGenerator *)this,&local_88,&local_58,inpf,&local_e8,true,
                   (QStringList *)&local_c8,false,true);
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        inpf = inpf + 1;
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    VCFilter::addFiles(this_00,(QStringList *)&local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"RESOURCES");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  VCFilter::addFiles(this_00,pPVar2);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->vcProject).ResourceFiles.Project = this;
  (this->vcProject).ResourceFiles.Config = &(this->vcProject).Configuration;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initResourceFiles()
{
    vcProject.ResourceFiles.Name = "Resource Files";
    vcProject.ResourceFiles.ParseFiles = _False;
    vcProject.ResourceFiles.Filter = "qrc;*"; //"rc;ico;cur;bmp;dlg;rc2;rct;bin;rgs;gif;jpg;jpeg;jpe;resx;ts;xlf;qrc";
    vcProject.ResourceFiles.Guid = _GUIDResourceFiles;

    // Bad hack, please look away -------------------------------------
    QString rcc_dep_cmd = project->values("rcc.depend_command").join(' ');
    if(!rcc_dep_cmd.isEmpty()) {
        const QStringList qrc_files = project->values("RESOURCES").toQStringList();
        QStringList deps;
        for (const QString &qrc_file : qrc_files) {
            callExtraCompilerDependCommand("rcc",
                                           rcc_dep_cmd,
                                           qrc_file,
                                           QString(),
                                           true,  // dep_lines
                                           &deps,
                                           false, // existingDepsOnly
                                           true   // checkCommandavailability
                                          );
        }
        vcProject.ResourceFiles.addFiles(deps);
    }
    // You may look again --------------------------------------------

    vcProject.ResourceFiles.addFiles(project->values("RESOURCES"));

    vcProject.ResourceFiles.Project = this;
    vcProject.ResourceFiles.Config = &(vcProject.Configuration);
}